

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

value_type * __thiscall
poplar::
map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
::update(map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
         *this,char_range key)

{
  uint32_t uVar1;
  bool bVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  char_range *key_00;
  char_range *key_01;
  type_conflict *ptVar5;
  reference pvVar6;
  value_type_conflict7 *pvVar7;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  *in_RDI;
  pair<const_int_*,_unsigned_long> pVar8;
  int *vptr;
  type_conflict *match;
  type *vptr_1;
  uint64_t node_id;
  undefined7 in_stack_fffffffffffffc48;
  uint8_t in_stack_fffffffffffffc4f;
  map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  *in_stack_fffffffffffffc50;
  compact_fkhash_nlm<int,_8UL> *in_stack_fffffffffffffc70;
  value_type_conflict7 *local_378;
  uint64_t in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffca8;
  char_range *in_stack_fffffffffffffcb8;
  compact_fkhash_nlm<int,_8UL> *in_stack_fffffffffffffcc0;
  compact_fkhash_nlm<int,_8UL> *this_00;
  uint64_t in_stack_fffffffffffffcd8;
  compact_fkhash_nlm<int,_8UL> *in_stack_fffffffffffffce0;
  uint64_t in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe7c;
  map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  *in_stack_fffffffffffffe80;
  char_range local_18;
  value_type_conflict7 *local_8;
  
  local_18.begin = in_RSI;
  local_18.end = in_RDX;
  bVar2 = char_range::empty(&local_18);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffc50,
               (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  if (local_18.end[-1] != '\0') {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffc50,
               (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  uVar4 = compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          ::size(&in_RDI->hash_trie_);
  if (uVar4 == 0) {
    if ((in_RDI->is_ready_ & 1U) == 0) {
      map(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
      operator=(in_stack_fffffffffffffc50,
                (map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
                 *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      ~map(in_stack_fffffffffffffc50);
    }
    in_RDI->size_ = in_RDI->size_ + 1;
    compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::add_root(&in_RDI->hash_trie_);
    local_8 = compact_fkhash_nlm<int,_8UL>::append
                        (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  }
  else {
    key_00 = (char_range *)
             compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             ::get_root(&in_RDI->hash_trie_);
    while (bVar2 = char_range::empty(&local_18), ((bVar2 ^ 0xffU) & 1) != 0) {
      pVar8 = compact_fkhash_nlm<int,_8UL>::compare
                        (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,key_00);
      key_01 = (char_range *)
               std::get<0ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x226b61);
      ptVar5 = std::get<1ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x226b70);
      if ((type)key_01->begin != (type)0x0) {
        return (value_type *)key_01->begin;
      }
      local_18.begin = local_18.begin + *ptVar5;
      while (this_00 = (compact_fkhash_nlm<int,_8UL> *)pVar8.first, in_RDI->lambda_ <= *ptVar5) {
        bVar2 = compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                ::add_child(in_stack_fffffffffffffca8,
                            (uint64_t *)
                            CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                            in_stack_fffffffffffffc98);
        if (bVar2) {
          expand_if_needed_(in_RDI,(uint64_t *)&stack0xfffffffffffffcd0);
          compact_fkhash_nlm<int,_8UL>::append_dummy(in_stack_fffffffffffffc70);
        }
        *ptVar5 = *ptVar5 - in_RDI->lambda_;
      }
      pvVar6 = std::array<unsigned_char,_256UL>::operator[]
                         ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffc50,
                          CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      if (*pvVar6 == 0xff) {
        uVar1 = in_RDI->num_codes_;
        in_RDI->num_codes_ = uVar1 + 1;
        pvVar6 = std::array<unsigned_char,_256UL>::operator[]
                           ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffc50,
                            CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
        *pvVar6 = (value_type_conflict3)uVar1;
        in_stack_fffffffffffffca7 = 0;
        if (in_RDI->num_codes_ == 0xff) {
          uVar3 = __cxa_allocate_exception(0x10);
          exception::exception
                    ((exception *)in_stack_fffffffffffffc50,
                     (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
          __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
        }
      }
      make_symb_(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,0x226d3c);
      bVar2 = compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              ::add_child(in_stack_fffffffffffffca8,
                          (uint64_t *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                          in_stack_fffffffffffffc98);
      if (bVar2) {
        expand_if_needed_(in_RDI,(uint64_t *)&stack0xfffffffffffffcd0);
        local_18.begin = local_18.begin + 1;
        in_RDI->size_ = in_RDI->size_ + 1;
        pvVar7 = compact_fkhash_nlm<int,_8UL>::append(this_00,key_01);
        return pvVar7;
      }
      local_18.begin = local_18.begin + 1;
    }
    pVar8 = compact_fkhash_nlm<int,_8UL>::compare
                      (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,key_00);
    local_378 = pVar8.first;
    local_8 = local_378;
    if (local_378 == (value_type_conflict7 *)0x0) {
      local_8 = (value_type_conflict7 *)0x0;
    }
  }
  return local_8;
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }